

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator-
          (TPZFMatrix<Fad<float>_> *__return_storage_ptr__,TPZFMatrix<Fad<float>_> *this,
          Fad<float> *val)

{
  int iVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  Fad<float> local_40;
  
  local_40.val_ = -val->val_;
  iVar1 = (val->dx_).num_elts;
  lVar4 = (long)iVar1;
  local_40.dx_.num_elts = 0;
  local_40.dx_.ptr_to_data = (float *)0x0;
  if (0 < lVar4) {
    local_40.dx_.num_elts = iVar1;
    local_40.dx_.ptr_to_data = (float *)operator_new__(lVar4 * 4);
    pfVar2 = (val->dx_).ptr_to_data;
    lVar3 = 0;
    do {
      local_40.dx_.ptr_to_data[lVar3] = -pfVar2[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar4 != lVar3);
  }
  local_40.defaultVal = 0.0;
  operator+(__return_storage_ptr__,this,&local_40);
  Fad<float>::~Fad(&local_40);
  return __return_storage_ptr__;
}

Assistant:

TPZFMatrix<TVar> TPZFMatrix<TVar>::operator-  (const TVar val ) const {
    return operator+( -val );
}